

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  size_type *psVar1;
  ulong uVar2;
  ostringstream *this_00;
  size_t **ppsVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer pVVar7;
  ulong *puVar8;
  char *description;
  IterateResult IVar9;
  qpTestResult testResult;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  float extraout_XMM0_Da;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  pointer local_258;
  pointer pSStack_250;
  pointer local_248 [2];
  Surface local_238;
  long lStack_220;
  undefined1 local_218 [24];
  long lStack_200;
  string local_1f0;
  ScopedLogSection local_1d0;
  RasterizationArguments local_1c8;
  undefined4 uStack_1b4;
  undefined1 local_1a8 [16];
  pointer local_198;
  float local_190;
  ios_base local_138 [8];
  ios_base local_130 [272];
  
  iVar4 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar4 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0xadb332);
  pVVar7 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pVVar7) {
    local_218._16_8_ = *(undefined8 *)pVVar7->m_data;
    lStack_200 = plVar5[3];
    local_218._0_8_ = (pointer)(local_218 + 0x10);
  }
  else {
    local_218._16_8_ = *(undefined8 *)pVVar7->m_data;
    local_218._0_8_ = (pointer)*plVar5;
  }
  local_218._8_8_ = plVar5[1];
  *plVar5 = (long)pVVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_218);
  ppsVar3 = (size_t **)&local_238.m_pixels.m_cap;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_238.m_pixels.m_cap = *puVar8;
    lStack_220 = plVar5[3];
    local_238._0_8_ = ppsVar3;
  }
  else {
    local_238.m_pixels.m_cap = *puVar8;
    local_238._0_8_ = (ulong *)*plVar5;
  }
  local_238.m_pixels.m_ptr = (void *)plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar2 = CONCAT44(local_1c8.greenBits,local_1c8.redBits) + (long)local_238.m_pixels.m_ptr;
  uVar10 = 0xf;
  if ((size_t **)local_238._0_8_ != ppsVar3) {
    uVar10 = local_238.m_pixels.m_cap;
  }
  if (uVar10 < uVar2) {
    uVar10 = 0xf;
    if ((int *)CONCAT44(local_1c8.subpixelBits,local_1c8.numSamples) != &local_1c8.blueBits) {
      uVar10 = CONCAT44(uStack_1b4,local_1c8.blueBits);
    }
    if (uVar2 <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,local_238._0_8_);
      goto LAB_0044db14;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_238,
                      (ulong)CONCAT44(local_1c8.subpixelBits,local_1c8.numSamples));
LAB_0044db14:
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1f0.field_2._M_allocated_capacity = *psVar1;
    local_1f0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar1;
    local_1f0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_1f0._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1c8.subpixelBits,local_1c8.numSamples) != &local_1c8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1c8.subpixelBits,local_1c8.numSamples),
                    CONCAT44(uStack_1b4,local_1c8.blueBits) + 1);
  }
  if ((size_t **)local_238._0_8_ != ppsVar3) {
    operator_delete((void *)local_238._0_8_,local_238.m_pixels.m_cap + 1);
  }
  if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,(ulong)((long)(float *)local_218._16_8_ + 1));
  }
  if (local_258 != (pointer)local_248) {
    operator_delete(local_258,(long)local_248[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1d0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1f0,&local_1f0);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this);
  iVar4 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_238,iVar4,iVar4);
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (pointer)0x0;
  local_218._16_8_ = (pointer)0x0;
  local_248[0] = (pointer)0x0;
  local_258 = (pointer)0x0;
  pSStack_250 = (pointer)0x0;
  if (extraout_XMM0_Da <= this->m_maxLineWidth) {
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,(ulong)*(uint *)&(this->super_BaseRenderingCase).field_0xc4,local_218,&local_258);
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,&local_238,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_218,
               this->m_primitiveDrawType);
    local_1c8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
    local_1c8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
    local_1c8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
    local_1c8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
    local_1c8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
    local_1a8._0_8_ = local_258;
    local_1a8._8_8_ = pSStack_250;
    local_198 = local_248[0];
    local_258 = (pointer)0x0;
    pSStack_250 = (pointer)0x0;
    local_248[0] = (pointer)0x0;
    local_190 = extraout_XMM0_Da;
    bVar12 = tcu::verifyLineGroupRasterization
                       (&local_238,(LineSceneSpec *)local_1a8,&local_1c8,
                        ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log);
    if (((this->super_BaseRenderingCase).m_numSamples < 2 || bVar12) || local_190 == 1.0) {
      if (!bVar12) {
        this->m_allIterationsPassed = false;
      }
    }
    else {
      this->m_multisampleRelaxationRequired = true;
    }
    if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
    }
  }
  else {
    local_1a8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)extraout_XMM0_Da);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  iVar4 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar4;
  IVar9 = CONTINUE;
  if (iVar4 == this->m_iterationCount) {
    pcVar11 = "Pass";
    if ((this->m_multisampleRelaxationRequired & 1U) != 0) {
      pcVar11 = "Rasterization of multisampled wide lines failed";
    }
    bVar12 = this->m_allIterationsPassed != false;
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar12) {
      testResult = (this->m_multisampleRelaxationRequired & 1) * 3;
    }
    description = "Incorrect rasterization";
    if (bVar12) {
      description = pcVar11;
    }
    IVar9 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,testResult,description);
  }
  if (local_258 != (pointer)0x0) {
    operator_delete(local_258,(long)local_248[0] - (long)local_258);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  tcu::Surface::~Surface(&local_238);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return IVar9;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			LineSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			// multisampled wide lines might not be supported
			if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
			{
				m_multisampleRelaxationRequired = true;
				compareOk = true;
			}

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}